

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# op_helper.c
# Opt level: O0

void r4k_helper_tlbinv_mipsel(CPUMIPSState_conflict2 *env)

{
  CPUMIPSTLBContext_conflict *pCVar1;
  long lVar2;
  bool bVar3;
  uint local_34;
  uint local_30;
  uint local_2c;
  int idx;
  r4k_tlb_t *tlb;
  uint32_t tlb_mmid;
  uint32_t MMID;
  uint16_t ASID;
  _Bool mi;
  CPUMIPSState_conflict2 *env_local;
  
  bVar3 = (env->CP0_Config5 >> 0x11 & 1U) == 0;
  local_30 = env->CP0_MemoryMapID;
  if (bVar3) {
    local_30 = (uint)(ushort)((ushort)env->CP0_EntryHi & (ushort)env->CP0_EntryHi_ASID_mask);
  }
  for (local_2c = 0; local_2c < env->tlb->nb_tlb; local_2c = local_2c + 1) {
    pCVar1 = env->tlb;
    lVar2 = (long)(int)local_2c * 0x28;
    if (bVar3) {
      local_34 = (uint)*(ushort *)((long)&pCVar1->mmu + lVar2 + 8);
    }
    else {
      local_34 = *(uint *)((long)&pCVar1->mmu + lVar2 + 0xc);
    }
    if (((*(ushort *)((long)&pCVar1->mmu + lVar2 + 0x10) & 1) == 0) && (local_34 == local_30)) {
      *(ushort *)((long)&pCVar1->mmu + lVar2 + 0x10) =
           *(ushort *)((long)&pCVar1->mmu + lVar2 + 0x10) & 0x7fff | 0x8000;
    }
  }
  cpu_mips_tlb_flush_mipsel(env);
  return;
}

Assistant:

void r4k_helper_tlbinv(CPUMIPSState *env)
{
    bool mi = !!((env->CP0_Config5 >> CP0C5_MI) & 1);
    uint16_t ASID = env->CP0_EntryHi & env->CP0_EntryHi_ASID_mask;
    uint32_t MMID = env->CP0_MemoryMapID;
    uint32_t tlb_mmid;
    r4k_tlb_t *tlb;
    int idx;

    MMID = mi ? MMID : (uint32_t) ASID;
    for (idx = 0; idx < env->tlb->nb_tlb; idx++) {
        tlb = &env->tlb->mmu.r4k.tlb[idx];
        tlb_mmid = mi ? tlb->MMID : (uint32_t) tlb->ASID;
        if (!tlb->G && tlb_mmid == MMID) {
            tlb->EHINV = 1;
        }
    }
    cpu_mips_tlb_flush(env);
}